

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acec2Mult.c
# Opt level: O0

Vec_Int_t * Sdb_StoFindInputs(Vec_Wec_t *vCuts,int Front)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *vVec1;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar3;
  Vec_Int_t *p_01;
  undefined4 local_60;
  int MinValue;
  int Min;
  int Max;
  int Entry;
  int k;
  int i;
  Vec_Int_t *vResB;
  Vec_Int_t *vResA;
  Vec_Int_t *vRes;
  Vec_Int_t *vCounts;
  Vec_Int_t *vCut;
  int fVerbose;
  int Front_local;
  Vec_Wec_t *vCuts_local;
  
  vVec1 = Vec_IntAlloc(100);
  p = Vec_IntAlloc(100);
  p_00 = Vec_IntAlloc(100);
  MinValue = 0;
  for (Entry = 0; iVar1 = Vec_WecSize(vCuts), Entry < iVar1; Entry = Entry + 1) {
    pVVar3 = Vec_WecEntry(vCuts,Entry);
    for (Max = 0; iVar1 = Vec_IntSize(pVVar3), Max < iVar1; Max = Max + 1) {
      iVar1 = Vec_IntEntry(pVVar3,Max);
      MinValue = Abc_MaxInt(MinValue,iVar1);
    }
  }
  pVVar3 = Vec_IntStart(MinValue + 1);
  for (Entry = 0; iVar1 = Vec_WecSize(vCuts), Entry < iVar1; Entry = Entry + 1) {
    p_01 = Vec_WecEntry(vCuts,Entry);
    for (Max = 0; iVar1 = Vec_IntSize(p_01), Max < iVar1; Max = Max + 1) {
      iVar1 = Vec_IntEntry(p_01,Max);
      Vec_IntAddToEntry(pVVar3,iVar1,1);
    }
  }
  Vec_IntWriteEntry(pVVar3,0,0);
  local_60 = 1000000000;
  for (Max = 0; iVar1 = Vec_IntSize(pVVar3), Max < iVar1; Max = Max + 1) {
    iVar1 = Vec_IntEntry(pVVar3,Max);
    if (iVar1 != 0) {
      local_60 = Abc_MinInt(local_60,iVar1);
    }
  }
  if (local_60 != 1000000000) {
    iVar1 = Vec_IntFind(pVVar3,local_60);
    Vec_IntPush(p,iVar1);
    Vec_IntWriteEntry(pVVar3,iVar1,0);
    for (Max = 0; iVar1 = Vec_IntSize(pVVar3), Max < iVar1; Max = Max + 1) {
      iVar1 = Vec_IntEntry(pVVar3,Max);
      if ((iVar1 == local_60) || (iVar1 == local_60 * 2)) {
        Vec_IntPush(p,Max);
        Vec_IntWriteEntry(pVVar3,Max,0);
      }
    }
    iVar1 = Vec_IntEntry(pVVar3,Front);
    Vec_IntPush(p_00,Front);
    Vec_IntWriteEntry(pVVar3,Front,0);
    for (Max = 0; iVar2 = Vec_IntSize(pVVar3), Max < iVar2; Max = Max + 1) {
      iVar2 = Vec_IntEntry(pVVar3,Max);
      if ((iVar2 == iVar1) || (iVar2 == iVar1 * 2)) {
        Vec_IntPush(p_00,Max);
        Vec_IntWriteEntry(pVVar3,Max,0);
      }
    }
    Vec_IntFree(pVVar3);
    Vec_IntPrint(p);
    Vec_IntPrint(p_00);
    Vec_IntAppend(vVec1,p);
    Vec_IntAppend(vVec1,p_00);
    Vec_IntFree(p);
    Vec_IntFree(p_00);
  }
  return vVec1;
}

Assistant:

Vec_Int_t * Sdb_StoFindInputs( Vec_Wec_t * vCuts, int Front )
{
    int fVerbose = 0;
    Vec_Int_t * vCut, * vCounts;
    Vec_Int_t * vRes = Vec_IntAlloc( 100 );
    Vec_Int_t * vResA = Vec_IntAlloc( 100 );
    Vec_Int_t * vResB = Vec_IntAlloc( 100 );
    int i, k, Entry, Max = 0, Min, MinValue;
    // find MAX value
    Vec_WecForEachLevel( vCuts, vCut, i )
        Vec_IntForEachEntry( vCut, Entry, k )
            Max = Abc_MaxInt( Max, Entry );
    // count how many times each value appears
    vCounts = Vec_IntStart( Max + 1 );
    Vec_WecForEachLevel( vCuts, vCut, i )
        Vec_IntForEachEntry( vCut, Entry, k )
            Vec_IntAddToEntry( vCounts, Entry, 1 );
    Vec_IntWriteEntry( vCounts, 0, 0 );
    // print out
    if ( fVerbose )
    Vec_IntForEachEntry( vCounts, Entry, k )
        if ( Entry )
            printf( "%5d %5d\n", k, Entry );
    // collect first part
    MinValue = ABC_INFINITY;
    Vec_IntForEachEntry( vCounts, Entry, k )
        if ( Entry )
            MinValue = Abc_MinInt( MinValue, Entry );
    if ( MinValue == ABC_INFINITY )
        return vRes;
    Min = Vec_IntFind( vCounts, MinValue );
    Vec_IntPush( vResA, Min );
    Vec_IntWriteEntry( vCounts, Min, 0 );
    Vec_IntForEachEntry( vCounts, Entry, k )
        if ( Entry == MinValue || Entry == 2*MinValue )
        {
            Vec_IntPush( vResA, k );
            Vec_IntWriteEntry( vCounts, k, 0 );
        }
    // collect second parts
    MinValue = Vec_IntEntry( vCounts, Front );
    Min = Front;
    Vec_IntPush( vResB, Min );
    Vec_IntWriteEntry( vCounts, Min, 0 );
    Vec_IntForEachEntry( vCounts, Entry, k )
        if ( Entry == MinValue || Entry == 2*MinValue )
        {
            Vec_IntPush( vResB, k );
            Vec_IntWriteEntry( vCounts, k, 0 );
        }
    Vec_IntFree( vCounts );
    Vec_IntPrint( vResA );
    Vec_IntPrint( vResB );
    // here we need to order the inputs

    // append
    Vec_IntAppend( vRes, vResA );
    Vec_IntAppend( vRes, vResB );
    Vec_IntFree( vResA );
    Vec_IntFree( vResB );
    return vRes;
}